

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

char * __thiscall
tinyxml2::XMLDeclaration::ParseDeep
          (XMLDeclaration *this,char *p,StrPair *param_2,int *curLineNumPtr)

{
  char *pcVar1;
  char *start;
  int *curLineNumPtr_local;
  StrPair *param_2_local;
  char *p_local;
  XMLDeclaration *this_local;
  
  pcVar1 = StrPair::ParseText(&(this->super_XMLNode)._value,p,"?>",2,curLineNumPtr);
  if (pcVar1 == (char *)0x0) {
    XMLDocument::SetError
              ((this->super_XMLNode)._document,XML_ERROR_PARSING_DECLARATION,p,(char *)0x0,
               (this->super_XMLNode)._parseLineNum);
  }
  return pcVar1;
}

Assistant:

char* XMLDeclaration::ParseDeep( char* p, StrPair*, int* curLineNumPtr )
{
    // Declaration parses as text.
    const char* start = p;
    p = _value.ParseText( p, "?>", StrPair::NEEDS_NEWLINE_NORMALIZATION, curLineNumPtr );
    if ( p == 0 ) {
        _document->SetError( XML_ERROR_PARSING_DECLARATION, start, 0, _parseLineNum );
    }
    return p;
}